

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SignOperator.cpp
# Opt level: O0

void __thiscall lts2::SignOperator::Apply(SignOperator *this,Mat *X,Mat *Ax)

{
  Mat *pMVar1;
  int iVar2;
  undefined1 auVar3 [12];
  int local_74;
  float *pfStack_70;
  int x;
  float *p_ax;
  float *p_x;
  int y;
  undefined4 local_54;
  undefined8 local_50;
  allocator local_41;
  string local_40 [32];
  Mat *local_20;
  Mat *Ax_local;
  Mat *X_local;
  SignOperator *this_local;
  
  local_20 = Ax;
  Ax_local = X;
  X_local = (Mat *)this;
  iVar2 = cv::Mat::type(X);
  pMVar1 = local_20;
  if ((iVar2 == 5) && (*(long *)(Ax_local + 0x10) != 0)) {
    cv::MatSize::operator()((MatSize *)((long)&p_x + 4));
    iVar2 = cv::Mat::type(Ax_local);
    cv::Mat::create(pMVar1,(long)&p_x + 4,iVar2);
    for (p_x._0_4_ = 0; (int)p_x < *(int *)(local_20 + 8); p_x._0_4_ = (int)p_x + 1) {
      p_ax = cv::Mat::ptr<float>(Ax_local,(int)p_x);
      pfStack_70 = cv::Mat::ptr<float>(local_20,(int)p_x);
      for (local_74 = 0; local_74 < *(int *)(local_20 + 0xc); local_74 = local_74 + 1) {
        if (*p_ax <= 1e-06) {
          if (-1e-06 <= *p_ax) {
            *pfStack_70 = 0.0;
          }
          else {
            *pfStack_70 = -1.0;
          }
        }
        else {
          *pfStack_70 = 1.0;
        }
        p_ax = p_ax + 1;
        pfStack_70 = pfStack_70 + 1;
      }
    }
    return;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"X.type() == CV_32F && X.data",&local_41);
  auVar3 = cv::error(-0xd7,local_40,"Apply",
                     "/workspace/llm4binary/github/license_c_cmakelists/sansuiso[P]LBDReconstruction/src/LBDReconstruction/SignOperator.cpp"
                     ,0x2f);
  local_54 = auVar3._8_4_;
  local_50 = auVar3._0_8_;
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  _Unwind_Resume(local_50);
}

Assistant:

void lts2::SignOperator::Apply(cv::Mat const &X, cv::Mat &Ax)
{
  CV_Assert(X.type() == CV_32F && X.data);

  Ax.create(X.size(), X.type());

#ifdef WITH_DISPATCH
  dispatch_queue_t queue = dispatch_get_global_queue(DISPATCH_QUEUE_PRIORITY_HIGH, 0);
  dispatch_apply(Ax.rows, queue,
                 ^(size_t y) {
                   float const *p_x = X.ptr<float>(y);
                   float *p_ax = Ax.ptr<float>(y);

                   for (int x = 0; x < Ax.cols; ++x, ++p_x, ++p_ax)
                   {
                     if (*p_x > MY_EPSILON) *p_ax = 1.0;
                     else if (*p_x < -MY_EPSILON) *p_ax = -1.0;
                     else *p_ax = 0.0;
                   }
                 });
#else
  for (int y = 0; y < Ax.rows; ++y)
  {
    float const *p_x = X.ptr<float>(y);
    float *p_ax = Ax.ptr<float>(y);

    for (int x = 0; x < Ax.cols; ++x, ++p_x, ++p_ax)
    {
      if (*p_x > MY_EPSILON) *p_ax = 1.0;
      else if (*p_x < -MY_EPSILON) *p_ax = -1.0;
      else *p_ax = 0.0;
    }
  }
#endif
}